

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::presolve(Highs *this)

{
  bool bVar1;
  int iVar2;
  HighsPresolveStatus HVar3;
  undefined8 uVar4;
  Highs *in_RDI;
  HighsPresolveStatus in_stack_00000014;
  Highs *in_stack_00000018;
  bool using_reduced_lp;
  bool force_lp_presolve;
  bool force_presolve;
  HighsStatus return_status;
  Highs *in_stack_00000270;
  undefined1 in_stack_00000316;
  undefined1 in_stack_00000317;
  Highs *in_stack_00000318;
  HighsModel *in_stack_ffffffffffffff98;
  Highs *in_stack_ffffffffffffffa0;
  HighsLogOptions *log_options_;
  string local_38 [33];
  byte local_17;
  undefined1 local_16;
  undefined1 local_15;
  HighsStatus highs_return_status;
  Highs *this_00;
  HighsStatus local_4;
  
  this_00 = in_RDI;
  bVar1 = HighsModel::needsMods
                    ((HighsModel *)in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98);
  if (bVar1) {
    highsLogUser(&(in_RDI->options_).super_HighsOptionsStruct.log_options,kError,
                 "Model contains infinite costs or semi-variables, so cannot be presolved independently\n"
                );
    local_4 = kError;
  }
  else {
    reportModelStats(in_stack_00000270);
    clearPresolve(in_stack_ffffffffffffffa0);
    bVar1 = HighsModel::isEmpty(&in_RDI->model_);
    if (bVar1) {
      in_RDI->model_presolve_status_ = kNotReduced;
    }
    else {
      local_15 = 1;
      ::highs::parallel::initialize_scheduler(0);
      iVar2 = ::highs::parallel::num_threads();
      in_RDI->max_threads = iVar2;
      if (((in_RDI->options_).super_HighsOptionsStruct.threads != 0) &&
         (in_RDI->max_threads != (in_RDI->options_).super_HighsOptionsStruct.threads)) {
        highsLogUser(&(in_RDI->options_).super_HighsOptionsStruct.log_options,kError,
                     "Option \'threads\' is set to %d but global scheduler has already been initialized to use %d threads. The previous scheduler instance can be destroyed by calling Highs::resetGlobalScheduler().\n"
                     ,(ulong)(uint)(in_RDI->options_).super_HighsOptionsStruct.threads,
                     (ulong)(uint)in_RDI->max_threads);
        return kError;
      }
      local_16 = 0;
      HVar3 = runPresolve(in_stack_00000318,(bool)in_stack_00000317,(bool)in_stack_00000316);
      in_RDI->model_presolve_status_ = HVar3;
    }
    local_17 = 0;
    HVar3 = in_RDI->model_presolve_status_;
    if (HVar3 == kNotPresolved) {
      highs_return_status = kError;
    }
    else if ((uint)HVar3 < 5) {
      if (in_RDI->model_presolve_status_ == kInfeasible) {
        setHighsModelStatusAndClearSolutionAndBasis
                  (in_stack_ffffffffffffffa0,
                   (HighsModelStatus)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      }
      else if (in_RDI->model_presolve_status_ == kNotReduced) {
        HighsModel::operator=((HighsModel *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      else if ((in_RDI->model_presolve_status_ == kReduced) ||
              (in_RDI->model_presolve_status_ == kReducedToEmpty)) {
        local_17 = 1;
      }
      highs_return_status = kOk;
    }
    else if (HVar3 == kTimeout) {
      local_17 = 1;
      highs_return_status = kWarning;
    }
    else {
      highsLogUser(&(in_RDI->options_).super_HighsOptionsStruct.log_options,kError,
                   "Presolve fails due to memory allocation error\n");
      setHighsModelStatusAndClearSolutionAndBasis
                (in_stack_ffffffffffffffa0,
                 (HighsModelStatus)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      highs_return_status = kError;
    }
    if ((local_17 & 1) != 0) {
      PresolveComponent::getReducedProblem(&in_RDI->presolve_);
      HighsLp::operator=((HighsLp *)in_stack_ffffffffffffffa0,&in_stack_ffffffffffffff98->lp_);
      HighsLp::setMatrixDimensions(&(in_RDI->presolved_model_).lp_);
    }
    log_options_ = &(in_RDI->options_).super_HighsOptionsStruct.log_options;
    presolveStatusToString_abi_cxx11_(in_stack_00000018,in_stack_00000014);
    uVar4 = std::__cxx11::string::c_str();
    highsLogUser(log_options_,kInfo,"Presolve status: %s\n",uVar4);
    std::__cxx11::string::~string(local_38);
    local_4 = returnFromHighs(this_00,highs_return_status);
  }
  return local_4;
}

Assistant:

HighsStatus Highs::presolve() {
  if (model_.needsMods(options_.infinite_cost)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model contains infinite costs or semi-variables, so cannot "
                 "be presolved independently\n");
    return HighsStatus::kError;
  }
  HighsStatus return_status = HighsStatus::kOk;

  this->reportModelStats();
  clearPresolve();
  if (model_.isEmpty()) {
    model_presolve_status_ = HighsPresolveStatus::kNotReduced;
  } else {
    const bool force_presolve = true;
    // make sure global scheduler is initialized before calling presolve, since
    // MIP presolve may use parallelism
    highs::parallel::initialize_scheduler(options_.threads);
    max_threads = highs::parallel::num_threads();
    if (options_.threads != 0 && max_threads != options_.threads) {
      highsLogUser(
          options_.log_options, HighsLogType::kError,
          "Option 'threads' is set to %d but global scheduler has already been "
          "initialized to use %d threads. The previous scheduler instance can "
          "be destroyed by calling Highs::resetGlobalScheduler().\n",
          (int)options_.threads, max_threads);
      return HighsStatus::kError;
    }
    const bool force_lp_presolve = false;
    model_presolve_status_ = runPresolve(force_lp_presolve, force_presolve);
  }

  bool using_reduced_lp = false;
  switch (model_presolve_status_) {
    case HighsPresolveStatus::kNotPresolved: {
      // Shouldn't happen
      assert(model_presolve_status_ != HighsPresolveStatus::kNotPresolved);
      return_status = HighsStatus::kError;
      break;
    }
    case HighsPresolveStatus::kNotReduced:
    case HighsPresolveStatus::kInfeasible:
    case HighsPresolveStatus::kReduced:
    case HighsPresolveStatus::kReducedToEmpty:
    case HighsPresolveStatus::kUnboundedOrInfeasible: {
      // All OK
      if (model_presolve_status_ == HighsPresolveStatus::kInfeasible) {
        // Infeasible model, so indicate that the incumbent model is
        // known as such
        setHighsModelStatusAndClearSolutionAndBasis(
            HighsModelStatus::kInfeasible);
      } else if (model_presolve_status_ == HighsPresolveStatus::kNotReduced) {
        // No reduction, so fill Highs presolved model with the
        // incumbent model
        presolved_model_ = model_;
      } else if (model_presolve_status_ == HighsPresolveStatus::kReduced ||
                 model_presolve_status_ ==
                     HighsPresolveStatus::kReducedToEmpty) {
        // Nontrivial reduction, so fill Highs presolved model with the
        // presolved model
        using_reduced_lp = true;
      }
      return_status = HighsStatus::kOk;
      break;
    }
    case HighsPresolveStatus::kTimeout: {
      // Timeout, so assume that it's OK to fill the Highs presolved model with
      // the presolved model, but return warning.
      using_reduced_lp = true;
      return_status = HighsStatus::kWarning;
      break;
    }
    default: {
      // case HighsPresolveStatus::kOutOfMemory
      assert(model_presolve_status_ == HighsPresolveStatus::kOutOfMemory);
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Presolve fails due to memory allocation error\n");
      setHighsModelStatusAndClearSolutionAndBasis(
          HighsModelStatus::kPresolveError);
      return_status = HighsStatus::kError;
    }
  }
  if (using_reduced_lp) {
    presolved_model_.lp_ = presolve_.getReducedProblem();
    presolved_model_.lp_.setMatrixDimensions();
  }

  highsLogUser(options_.log_options, HighsLogType::kInfo,
               "Presolve status: %s\n",
               presolveStatusToString(model_presolve_status_).c_str());
  return returnFromHighs(return_status);
}